

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O0

int mixed_make_segment_repeat(float time,uint32_t samplerate,mixed_segment *segment)

{
  void *pvVar1;
  void *pvVar2;
  double dVar3;
  repeat_segment_data *data;
  mixed_segment *segment_local;
  uint32_t samplerate_local;
  float time_local;
  
  if (0.0 < time) {
    pvVar1 = (*mixed_calloc)(1,0x38);
    if (pvVar1 == (void *)0x0) {
      mixed_err(1);
      samplerate_local = 0;
    }
    else {
      dVar3 = ceil((double)(time * (float)samplerate));
      *(int *)((long)pvVar1 + 0x18) = (int)(long)dVar3;
      pvVar2 = (*mixed_calloc)((size_t)*(undefined4 *)((long)pvVar1 + 0x18),4);
      *(void **)((long)pvVar1 + 0x10) = pvVar2;
      if (*(long *)((long)pvVar1 + 0x10) == 0) {
        mixed_err(1);
        (*mixed_free)(pvVar1);
        samplerate_local = 0;
      }
      else {
        *(undefined4 *)((long)pvVar1 + 0x28) = 1;
        *(float *)((long)pvVar1 + 0x20) = time;
        *(uint32_t *)((long)pvVar1 + 0x24) = samplerate;
        *(undefined4 *)((long)pvVar1 + 0x2c) = 0;
        *(undefined4 *)((long)pvVar1 + 0x30) = 100;
        segment->free = repeat_segment_free;
        segment->start = repeat_segment_start;
        segment->mix = repeat_segment_mix;
        segment->set_in = repeat_segment_set_in;
        segment->set_out = repeat_segment_set_out;
        segment->info = repeat_segment_info;
        segment->get = repeat_segment_get;
        segment->set = repeat_segment_set;
        segment->data = pvVar1;
        samplerate_local = 1;
      }
    }
  }
  else {
    mixed_err(8);
    samplerate_local = 0;
  }
  return samplerate_local;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_repeat(float time, uint32_t samplerate, struct mixed_segment *segment){
  if(time <= 0.0f){
    mixed_err(MIXED_INVALID_VALUE);
    return 0;
  }

  struct repeat_segment_data *data = mixed_calloc(1, sizeof(struct repeat_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->buffer_size = ceil(time * samplerate);
  data->buffer = mixed_calloc(data->buffer_size, sizeof(float));
  if(!data->buffer){
    mixed_err(MIXED_OUT_OF_MEMORY);
    mixed_free(data);
    return 0;
  }

  data->mode = MIXED_RECORD;
  data->time = time;
  data->samplerate = samplerate;
  data->fade_position = 0;
  data->fade_length = 100;

  segment->free = repeat_segment_free;
  segment->start = repeat_segment_start;
  segment->mix = repeat_segment_mix;
  segment->set_in = repeat_segment_set_in;
  segment->set_out = repeat_segment_set_out;
  segment->info = repeat_segment_info;
  segment->get = repeat_segment_get;
  segment->set = repeat_segment_set;
  segment->data = data;
  return 1;
}